

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_1c02d::CpuTest_rti_Test::TestBody(CpuTest_rti_Test *this)

{
  NiceMock<n_e_s::core::test::MockMmu> *this_00;
  int iVar1;
  TypedExpectation<unsigned_char_(unsigned_short)> *pTVar2;
  ActionInterface<unsigned_char_(unsigned_short)> *pAVar3;
  char cVar4;
  _func_int *message;
  AssertionResult gtest_ar;
  _Any_data local_90;
  code *local_80;
  int *local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  undefined1 local_60 [8];
  MatcherBase<unsigned_short> local_58;
  MatcherBase<unsigned_short> local_40;
  
  (this->super_CpuTest).registers.pc = 0x1234;
  n_e_s::core::test::CpuTest::stage_instruction(&this->super_CpuTest,'@');
  (this->super_CpuTest).registers.sp = '\n';
  (this->super_CpuTest).expected.p = '#';
  (this->super_CpuTest).expected.sp = '\r';
  (this->super_CpuTest).expected.pc = 0xdead;
  this_00 = &(this->super_CpuTest).mmu;
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_90,0x1235);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_90);
  testing::internal::GetWithoutMatchers();
  testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
            ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,
             "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu.cpp"
             ,0x1af,"mmu","read_byte(0x1235)");
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)
             &((MockSpec<unsigned_char_(unsigned_short)> *)local_60)->matchers_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&local_90);
  testing::Matcher<unsigned_short>::Matcher
            ((Matcher<unsigned_short> *)&local_40,(this->super_CpuTest).registers.sp + 0x101);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_40);
  testing::internal::GetWithoutMatchers();
  pTVar2 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                      ,0x1b1,"mmu","read_byte(kStackOffset + registers.sp + 1)");
  local_70 = (int *)operator_new(4);
  *local_70 = 0x13;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>(&local_68,local_70);
  pAVar3 = (ActionInterface<unsigned_char_(unsigned_short)> *)operator_new(0x10);
  pAVar3->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002a10a0;
  iVar1 = *local_70;
  *(int *)&pAVar3[1]._vptr_ActionInterface = iVar1;
  *(char *)((long)&pAVar3[1]._vptr_ActionInterface + 4) = (char)iVar1;
  testing::Action<unsigned_char_(unsigned_short)>::Action
            ((Action<unsigned_char_(unsigned_short)> *)&local_90,pAVar3);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar2,(Action<unsigned_char_(unsigned_short)> *)&local_90);
  if (local_80 != (code *)0x0) {
    (*local_80)(&local_90,&local_90,3);
  }
  if (local_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68._M_pi);
  }
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)
             &((MockSpec<unsigned_char_(unsigned_short)> *)local_60)->matchers_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_40);
  testing::Matcher<unsigned_short>::Matcher
            ((Matcher<unsigned_short> *)&local_40,(this->super_CpuTest).registers.sp + 0x102);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_40);
  testing::internal::GetWithoutMatchers();
  pTVar2 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                      ,0x1b3,"mmu","read_byte(kStackOffset + registers.sp + 2)");
  local_70 = (int *)operator_new(4);
  *local_70 = 0xad;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>(&local_68,local_70);
  pAVar3 = (ActionInterface<unsigned_char_(unsigned_short)> *)operator_new(0x10);
  pAVar3->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002a10a0;
  iVar1 = *local_70;
  *(int *)&pAVar3[1]._vptr_ActionInterface = iVar1;
  *(char *)((long)&pAVar3[1]._vptr_ActionInterface + 4) = (char)iVar1;
  testing::Action<unsigned_char_(unsigned_short)>::Action
            ((Action<unsigned_char_(unsigned_short)> *)&local_90,pAVar3);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar2,(Action<unsigned_char_(unsigned_short)> *)&local_90);
  if (local_80 != (code *)0x0) {
    (*local_80)(&local_90,&local_90,3);
  }
  if (local_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68._M_pi);
  }
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)
             &((MockSpec<unsigned_char_(unsigned_short)> *)local_60)->matchers_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_40);
  testing::Matcher<unsigned_short>::Matcher
            ((Matcher<unsigned_short> *)&local_40,(this->super_CpuTest).registers.sp + 0x103);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_40);
  testing::internal::GetWithoutMatchers();
  pTVar2 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                      ,0x1b5,"mmu","read_byte(kStackOffset + registers.sp + 3)");
  local_70 = (int *)operator_new(4);
  *local_70 = 0xde;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>(&local_68,local_70);
  pAVar3 = (ActionInterface<unsigned_char_(unsigned_short)> *)operator_new(0x10);
  pAVar3->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002a10a0;
  iVar1 = *local_70;
  *(int *)&pAVar3[1]._vptr_ActionInterface = iVar1;
  *(char *)((long)&pAVar3[1]._vptr_ActionInterface + 4) = (char)iVar1;
  testing::Action<unsigned_char_(unsigned_short)>::Action
            ((Action<unsigned_char_(unsigned_short)> *)&local_90,pAVar3);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar2,(Action<unsigned_char_(unsigned_short)> *)&local_90);
  if (local_80 != (code *)0x0) {
    (*local_80)(&local_90,&local_90,3);
  }
  if (local_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68._M_pi);
  }
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)
             &((MockSpec<unsigned_char_(unsigned_short)> *)local_60)->matchers_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_40);
  cVar4 = '\x06';
  do {
    (*(((this->super_CpuTest).cpu._M_t.
        super___uniq_ptr_impl<n_e_s::core::IMos6502,_std::default_delete<n_e_s::core::IMos6502>_>.
        _M_t.
        super__Tuple_impl<0UL,_n_e_s::core::IMos6502_*,_std::default_delete<n_e_s::core::IMos6502>_>
        .super__Head_base<0UL,_n_e_s::core::IMos6502_*,_false>._M_head_impl)->super_ICpu)._vptr_ICpu
      [2])();
    cVar4 = cVar4 + -1;
  } while (cVar4 != '\0');
  testing::internal::CmpHelperEQ<n_e_s::core::CpuRegisters,n_e_s::core::CpuRegisters>
            ((internal *)local_60,"expected","registers",&(this->super_CpuTest).expected,
             &(this->super_CpuTest).registers);
  if (local_60[0] == '\0') {
    testing::Message::Message((Message *)&local_90);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_58.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = (_func_int *)0x247c3a;
    }
    else {
      message = *local_58.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu.cpp"
               ,0x1b9,(char *)message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_40);
    if ((long *)local_90._M_unused._0_8_ != (long *)0x0) {
      (**(code **)(*local_90._M_unused._M_object + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_58.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&((MockSpec<unsigned_char_(unsigned_short)> *)local_60)->matchers_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_58.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface);
  }
  return;
}

Assistant:

TEST_F(CpuTest, rti) {
    registers.pc = 0x1234;
    stage_instruction(RTI);
    registers.sp = 0x0A;
    expected.p = static_cast<uint8_t>(Z_FLAG | C_FLAG) | FLAG_5;
    expected.sp = registers.sp + static_cast<uint8_t>(3);
    expected.pc = 0xDEAD;

    // Dummy read
    EXPECT_CALL(mmu, read_byte(0x1235));

    EXPECT_CALL(mmu, read_byte(kStackOffset + registers.sp + 1))
            .WillOnce(Return(static_cast<uint8_t>(Z_FLAG | C_FLAG) | B_FLAG));
    EXPECT_CALL(mmu, read_byte(kStackOffset + registers.sp + 2))
            .WillOnce(Return(0xAD));
    EXPECT_CALL(mmu, read_byte(kStackOffset + registers.sp + 3))
            .WillOnce(Return(0xDE));

    step_execution(6);
    EXPECT_EQ(expected, registers);
}